

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall
cmQtAutoMocUic::JobT::RunProcess
          (JobT *this,GenT genType,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *infoMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  void *pvVar3;
  string msg;
  string local_68;
  string local_48;
  
  pvVar3 = ((this->super_JobT).Pool_)->UserData_;
  if (*(int *)((long)pvVar3 + 0x98) != 0) {
    paVar1 = &local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    if ((infoMessage != (string *)0x0) && (infoMessage->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_68);
      if (local_68._M_dataplus._M_p[local_68._M_string_length - 1] != '\n') {
        std::__cxx11::string::push_back((char)&local_68);
      }
    }
    cmQtAutoGen::QuotedCommand(&local_48,command);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back((char)&local_68);
    cmQtAutoGenerator::Logger::Info
              ((Logger *)((long)((this->super_JobT).Pool_)->UserData_ + 0x70),genType,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    pvVar3 = ((this->super_JobT).Pool_)->UserData_;
  }
  bVar2 = cmWorkerPool::JobT::RunProcess
                    (&this->super_JobT,result,command,(string *)((long)pvVar3 + 0x128));
  return bVar2;
}

Assistant:

bool cmQtAutoMocUic::JobT::RunProcess(GenT genType,
                                      cmWorkerPool::ProcessResultT& result,
                                      std::vector<std::string> const& command,
                                      std::string* infoMessage)
{
  // Log command
  if (Log().Verbose()) {
    std::string msg;
    if ((infoMessage != nullptr) && !infoMessage->empty()) {
      msg = *infoMessage;
      if (msg.back() != '\n') {
        msg += '\n';
      }
    }
    msg += QuotedCommand(command);
    msg += '\n';
    Log().Info(genType, msg);
  }
  return cmWorkerPool::JobT::RunProcess(result, command,
                                        BaseConst().AutogenBuildDir);
}